

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

bool __thiscall
CPubKey::Derive(CPubKey *this,CPubKey *pubkeyChild,ChainCode *ccChild,uint nChild,ChainCode *cc)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  int in_ECX;
  CPubKey *in_RDI;
  ChainCode *in_R8;
  long in_FS_OFFSET;
  size_t publen;
  uchar pub [33];
  secp256k1_pubkey pubkey;
  uchar out [64];
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 uVar6;
  uchar *in_stack_ffffffffffffff00;
  secp256k1_context *pbegin;
  uchar in_stack_ffffffffffffff1b;
  bool local_c1;
  size_t in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  secp256k1_pubkey *in_stack_ffffffffffffff50;
  secp256k1_context *in_stack_ffffffffffffff58;
  uchar *in_stack_ffffffffffffff60;
  secp256k1_context *in_stack_ffffffffffffff68;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValid((CPubKey *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  if (!bVar2) {
    __assert_fail("IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x14d,
                  "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                 );
  }
  if (in_ECX < 0) {
    __assert_fail("(nChild >> 31) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x14e,
                  "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                 );
  }
  uVar3 = size((CPubKey *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  if (uVar3 != 0x21) {
    __assert_fail("size() == COMPRESSED_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pubkey.cpp"
                  ,0x14f,
                  "bool CPubKey::Derive(CPubKey &, ChainCode &, unsigned int, const ChainCode &) const"
                 );
  }
  puVar5 = begin((CPubKey *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  uVar6 = CONCAT13(*puVar5,(int3)in_stack_fffffffffffffefc);
  begin((CPubKey *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  BIP32Hash(in_R8,(uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff1b,in_stack_ffffffffffffff00,
            (uchar *)CONCAT44(uVar6,in_ECX));
  puVar5 = base_blob<256U>::begin
                     ((base_blob<256U> *)
                      CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  *(undefined8 *)puVar5 = local_28;
  *(undefined8 *)(puVar5 + 8) = local_20;
  *(undefined8 *)(puVar5 + 0x10) = local_18;
  *(undefined8 *)(puVar5 + 0x18) = local_10;
  pbegin = secp256k1_context_static;
  size((CPubKey *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  iVar4 = secp256k1_ec_pubkey_parse
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     (uchar *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                     in_stack_ffffffffffffff40);
  if (iVar4 == 0) {
    local_c1 = false;
  }
  else {
    iVar4 = secp256k1_ec_pubkey_tweak_add
                      (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (uchar *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (iVar4 == 0) {
      local_c1 = false;
    }
    else {
      secp256k1_ec_pubkey_serialize
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                 (size_t *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c);
      Set<unsigned_char*>(in_RDI,(uchar *)pbegin,(uchar *)CONCAT44(uVar6,in_ECX));
      local_c1 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c1;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Derive(CPubKey& pubkeyChild, ChainCode &ccChild, unsigned int nChild, const ChainCode& cc) const {
    assert(IsValid());
    assert((nChild >> 31) == 0);
    assert(size() == COMPRESSED_SIZE);
    unsigned char out[64];
    BIP32Hash(cc, nChild, *begin(), begin()+1, out);
    memcpy(ccChild.begin(), out+32, 32);
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    if (!secp256k1_ec_pubkey_tweak_add(secp256k1_context_static, &pubkey, out)) {
        return false;
    }
    unsigned char pub[COMPRESSED_SIZE];
    size_t publen = COMPRESSED_SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_COMPRESSED);
    pubkeyChild.Set(pub, pub + publen);
    return true;
}